

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

void __thiscall Bstrlib::String::String(String *this,int len,char *s)

{
  int iVar1;
  size_t sVar2;
  uchar *puVar3;
  
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  (this->super_tagbstring).data = (uchar *)0x0;
  if (s != (char *)0x0) {
    sVar2 = strlen(s);
    (this->super_tagbstring).slen = (int)sVar2;
    iVar1 = (int)sVar2 + 1;
    if (iVar1 <= len) {
      iVar1 = len;
    }
    (this->super_tagbstring).mlen = iVar1;
    puVar3 = (uchar *)malloc((long)iVar1);
    (this->super_tagbstring).data = puVar3;
    if (puVar3 == (uchar *)0x0) {
      (this->super_tagbstring).mlen = 0;
      (this->super_tagbstring).slen = 0;
      fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
              "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
              ,0x98,"Failure in (int len, char *) constructor");
    }
    memcpy((this->super_tagbstring).data,s,(long)(this->super_tagbstring).slen + 1);
    return;
  }
  return;
}

Assistant:

String::String(int len, const char *s)
    {
        slen = mlen = 0; data = 0;
        if (s)
        {
            slen = (int)strlen(s);
            mlen = slen + 1;
            if (mlen < len)
                mlen = len;

            data = (uint8 * ) malloc(mlen);
            if (!data)
            {
                mlen = slen = 0;
                bstringThrow("Failure in (int len, char *) constructor");
            }
            memcpy(data, s, slen + 1);
        }
    }